

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

NodeSet * __thiscall
capnp::compiler::NodeTranslator::getBootstrapNode
          (NodeSet *__return_storage_ptr__,NodeTranslator *this)

{
  AuxNode *pAVar1;
  AuxNode *pAVar2;
  size_t sVar3;
  ArrayBuilder<capnp::schema::Node::SourceInfo::Reader> local_d8;
  ArrayBuilder<capnp::schema::Node::Reader> builder;
  Reader local_90;
  ReaderFor<capnp::schema::Node> nodeReader;
  
  sVar3 = ((long)(this->groups).builder.pos - (long)(this->groups).builder.ptr >> 6) +
          ((long)(this->paramStructs).builder.pos - (long)(this->paramStructs).builder.ptr >> 6) + 1
  ;
  local_d8.ptr = kj::_::HeapArrayDisposer::
                 allocateUninitialized<capnp::schema::Node::SourceInfo::Reader>(sVar3);
  local_d8.endPtr = local_d8.ptr + sVar3;
  local_d8.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_d8.pos = local_d8.ptr;
  capnp::_::OrphanGetImpl<capnp::schema::Node::SourceInfo,_(capnp::Kind)3>::applyReader
            (&local_90,&(this->sourceInfo).builder);
  ((local_d8.pos)->_reader).dataSize = local_90._reader.dataSize;
  ((local_d8.pos)->_reader).pointerCount = local_90._reader.pointerCount;
  *(undefined2 *)&((local_d8.pos)->_reader).field_0x26 = local_90._reader._38_2_;
  ((local_d8.pos)->_reader).nestingLimit = local_90._reader.nestingLimit;
  *(undefined4 *)&((local_d8.pos)->_reader).field_0x2c = local_90._reader._44_4_;
  ((local_d8.pos)->_reader).data = local_90._reader.data;
  ((local_d8.pos)->_reader).pointers = local_90._reader.pointers;
  ((local_d8.pos)->_reader).segment = local_90._reader.segment;
  ((local_d8.pos)->_reader).capTable = local_90._reader.capTable;
  pAVar1 = (this->groups).builder.pos;
  for (pAVar2 = (this->groups).builder.ptr; local_d8.pos = local_d8.pos + 1, pAVar2 != pAVar1;
      pAVar2 = pAVar2 + 1) {
    capnp::_::OrphanGetImpl<capnp::schema::Node::SourceInfo,_(capnp::Kind)3>::applyReader
              (&local_90,&(pAVar2->sourceInfo).builder);
    ((local_d8.pos)->_reader).dataSize = local_90._reader.dataSize;
    ((local_d8.pos)->_reader).pointerCount = local_90._reader.pointerCount;
    *(undefined2 *)&((local_d8.pos)->_reader).field_0x26 = local_90._reader._38_2_;
    ((local_d8.pos)->_reader).nestingLimit = local_90._reader.nestingLimit;
    *(undefined4 *)&((local_d8.pos)->_reader).field_0x2c = local_90._reader._44_4_;
    ((local_d8.pos)->_reader).data = local_90._reader.data;
    ((local_d8.pos)->_reader).pointers = local_90._reader.pointers;
    ((local_d8.pos)->_reader).segment = local_90._reader.segment;
    ((local_d8.pos)->_reader).capTable = local_90._reader.capTable;
  }
  pAVar1 = (this->paramStructs).builder.pos;
  for (pAVar2 = (this->paramStructs).builder.ptr; pAVar2 != pAVar1; pAVar2 = pAVar2 + 1) {
    capnp::_::OrphanGetImpl<capnp::schema::Node::SourceInfo,_(capnp::Kind)3>::applyReader
              (&local_90,&(pAVar2->sourceInfo).builder);
    ((local_d8.pos)->_reader).dataSize = local_90._reader.dataSize;
    ((local_d8.pos)->_reader).pointerCount = local_90._reader.pointerCount;
    *(undefined2 *)&((local_d8.pos)->_reader).field_0x26 = local_90._reader._38_2_;
    ((local_d8.pos)->_reader).nestingLimit = local_90._reader.nestingLimit;
    *(undefined4 *)&((local_d8.pos)->_reader).field_0x2c = local_90._reader._44_4_;
    ((local_d8.pos)->_reader).data = local_90._reader.data;
    ((local_d8.pos)->_reader).pointers = local_90._reader.pointers;
    ((local_d8.pos)->_reader).segment = local_90._reader.segment;
    ((local_d8.pos)->_reader).capTable = local_90._reader.capTable;
    local_d8.pos = local_d8.pos + 1;
  }
  capnp::_::OrphanGetImpl<capnp::schema::Node,_(capnp::Kind)3>::applyReader
            (&nodeReader,&(this->wipNode).builder);
  if ((nodeReader._reader.dataSize < 0x70) || (*(short *)((long)nodeReader._reader.data + 0xc) != 3)
     ) {
    (__return_storage_ptr__->node)._reader.dataSize = nodeReader._reader.dataSize;
    (__return_storage_ptr__->node)._reader.pointerCount = nodeReader._reader.pointerCount;
    *(short *)&(__return_storage_ptr__->node)._reader.field_0x26 = nodeReader._reader._38_2_;
    (__return_storage_ptr__->node)._reader.nestingLimit = nodeReader._reader.nestingLimit;
    *(undefined4 *)&(__return_storage_ptr__->node)._reader.field_0x2c = nodeReader._reader._44_4_;
    (__return_storage_ptr__->node)._reader.data = nodeReader._reader.data;
    (__return_storage_ptr__->node)._reader.pointers = nodeReader._reader.pointers;
    (__return_storage_ptr__->node)._reader.segment = nodeReader._reader.segment;
    (__return_storage_ptr__->node)._reader.capTable = nodeReader._reader.capTable;
    sVar3 = (long)(this->groups).builder.pos - (long)(this->groups).builder.ptr >> 6;
    builder.pos = kj::_::HeapArrayDisposer::allocateUninitialized<capnp::schema::Node::Reader>
                            (sVar3);
    builder.endPtr = builder.pos + sVar3;
    builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    builder.ptr = builder.pos;
    for (pAVar2 = (this->groups).builder.ptr; pAVar2 != (this->groups).builder.pos;
        pAVar2 = pAVar2 + 1) {
      capnp::_::OrphanGetImpl<capnp::schema::Node,_(capnp::Kind)3>::applyReader
                ((Reader *)&local_90,(OrphanBuilder *)pAVar2);
      ((builder.pos)->_reader).dataSize = local_90._reader.dataSize;
      ((builder.pos)->_reader).pointerCount = local_90._reader.pointerCount;
      *(undefined2 *)&((builder.pos)->_reader).field_0x26 = local_90._reader._38_2_;
      ((builder.pos)->_reader).nestingLimit = local_90._reader.nestingLimit;
      *(undefined4 *)&((builder.pos)->_reader).field_0x2c = local_90._reader._44_4_;
      ((builder.pos)->_reader).data = local_90._reader.data;
      ((builder.pos)->_reader).pointers = local_90._reader.pointers;
      ((builder.pos)->_reader).segment = local_90._reader.segment;
      ((builder.pos)->_reader).capTable = local_90._reader.capTable;
      builder.pos = builder.pos + 1;
    }
    (__return_storage_ptr__->auxNodes).ptr = builder.ptr;
    (__return_storage_ptr__->auxNodes).size_ = ((long)builder.pos - (long)builder.ptr) / 0x30;
    (__return_storage_ptr__->auxNodes).disposer = builder.disposer;
    builder.ptr = (Reader *)0x0;
    builder.pos = (RemoveConst<capnp::schema::Node::Reader> *)0x0;
    builder.endPtr = (Reader *)0x0;
    kj::ArrayBuilder<capnp::schema::Node::Reader>::dispose(&builder);
  }
  else {
    (__return_storage_ptr__->node)._reader.dataSize = nodeReader._reader.dataSize;
    (__return_storage_ptr__->node)._reader.pointerCount = nodeReader._reader.pointerCount;
    *(short *)&(__return_storage_ptr__->node)._reader.field_0x26 = nodeReader._reader._38_2_;
    (__return_storage_ptr__->node)._reader.nestingLimit = nodeReader._reader.nestingLimit;
    *(undefined4 *)&(__return_storage_ptr__->node)._reader.field_0x2c = nodeReader._reader._44_4_;
    (__return_storage_ptr__->node)._reader.data = nodeReader._reader.data;
    (__return_storage_ptr__->node)._reader.pointers = nodeReader._reader.pointers;
    (__return_storage_ptr__->node)._reader.segment = nodeReader._reader.segment;
    (__return_storage_ptr__->node)._reader.capTable = nodeReader._reader.capTable;
    sVar3 = (long)(this->paramStructs).builder.pos - (long)(this->paramStructs).builder.ptr >> 6;
    builder.pos = kj::_::HeapArrayDisposer::allocateUninitialized<capnp::schema::Node::Reader>
                            (sVar3);
    builder.endPtr = builder.pos + sVar3;
    builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    builder.ptr = builder.pos;
    for (pAVar2 = (this->paramStructs).builder.ptr; pAVar2 != (this->paramStructs).builder.pos;
        pAVar2 = pAVar2 + 1) {
      capnp::_::OrphanGetImpl<capnp::schema::Node,_(capnp::Kind)3>::applyReader
                ((Reader *)&local_90,(OrphanBuilder *)pAVar2);
      ((builder.pos)->_reader).dataSize = local_90._reader.dataSize;
      ((builder.pos)->_reader).pointerCount = local_90._reader.pointerCount;
      *(undefined2 *)&((builder.pos)->_reader).field_0x26 = local_90._reader._38_2_;
      ((builder.pos)->_reader).nestingLimit = local_90._reader.nestingLimit;
      *(undefined4 *)&((builder.pos)->_reader).field_0x2c = local_90._reader._44_4_;
      ((builder.pos)->_reader).data = local_90._reader.data;
      ((builder.pos)->_reader).pointers = local_90._reader.pointers;
      ((builder.pos)->_reader).segment = local_90._reader.segment;
      ((builder.pos)->_reader).capTable = local_90._reader.capTable;
      builder.pos = builder.pos + 1;
    }
    (__return_storage_ptr__->auxNodes).ptr = builder.ptr;
    (__return_storage_ptr__->auxNodes).size_ = ((long)builder.pos - (long)builder.ptr) / 0x30;
    (__return_storage_ptr__->auxNodes).disposer = builder.disposer;
    builder.ptr = (Reader *)0x0;
    builder.pos = (RemoveConst<capnp::schema::Node::Reader> *)0x0;
    builder.endPtr = (Reader *)0x0;
    kj::ArrayBuilder<capnp::schema::Node::Reader>::dispose(&builder);
  }
  (__return_storage_ptr__->sourceInfo).ptr = local_d8.ptr;
  (__return_storage_ptr__->sourceInfo).size_ = ((long)local_d8.pos - (long)local_d8.ptr) / 0x30;
  (__return_storage_ptr__->sourceInfo).disposer = local_d8.disposer;
  local_d8.ptr = (Reader *)0x0;
  local_d8.pos = (RemoveConst<capnp::schema::Node::SourceInfo::Reader> *)0x0;
  local_d8.endPtr = (Reader *)0x0;
  kj::ArrayBuilder<capnp::schema::Node::SourceInfo::Reader>::dispose(&local_d8);
  return __return_storage_ptr__;
}

Assistant:

NodeTranslator::NodeSet NodeTranslator::getBootstrapNode() {
  auto sourceInfos = kj::heapArrayBuilder<schema::Node::SourceInfo::Reader>(
      1 + groups.size() + paramStructs.size());
  sourceInfos.add(sourceInfo.getReader());
  for (auto& group: groups) {
    sourceInfos.add(group.sourceInfo.getReader());
  }
  for (auto& paramStruct: paramStructs) {
    sourceInfos.add(paramStruct.sourceInfo.getReader());
  }

  auto nodeReader = wipNode.getReader();
  if (nodeReader.isInterface()) {
    return NodeSet {
      nodeReader,
      KJ_MAP(g, paramStructs) { return g.node.getReader(); },
      sourceInfos.finish()
    };
  } else {
    return NodeSet {
      nodeReader,
      KJ_MAP(g, groups) { return g.node.getReader(); },
      sourceInfos.finish()
    };
  }
}